

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int unicodeIsException(unicode_tokenizer *p,int iCode)

{
  int iVar1;
  int local_30;
  int iTest;
  int iHi;
  int iLo;
  int *a;
  int iCode_local;
  unicode_tokenizer *p_local;
  
  if (0 < p->nException) {
    iTest = 0;
    local_30 = p->nException + -1;
    while (iTest <= local_30) {
      iVar1 = (local_30 + iTest) / 2;
      if (iCode == p->aiException[iVar1]) {
        return 1;
      }
      if (p->aiException[iVar1] < iCode) {
        iTest = iVar1 + 1;
      }
      else {
        local_30 = iVar1 + -1;
      }
    }
  }
  return 0;
}

Assistant:

static int unicodeIsException(unicode_tokenizer *p, int iCode){
  if( p->nException>0 ){
    int *a = p->aiException;
    int iLo = 0;
    int iHi = p->nException-1;

    while( iHi>=iLo ){
      int iTest = (iHi + iLo) / 2;
      if( iCode==a[iTest] ){
        return 1;
      }else if( iCode>a[iTest] ){
        iLo = iTest+1;
      }else{
        iHi = iTest-1;
      }
    }
  }

  return 0;
}